

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::noViols(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *tol)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  pointer pnVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  cpp_dec_float<100U,_int,_void> *pcVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_88;
  
  iVar4 = (this->thecovectors->set).thenum;
  if (this->theType == ENTER) {
    if (iVar4 < 1) {
      return true;
    }
    lVar7 = 0;
    lVar5 = 0;
    do {
      pnVar2 = (this->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar2->m_backend + lVar7);
      pcVar6 = (cpp_dec_float<100U,_int,_void> *)
               ((long)&(((this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar7);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      if (pcVar6 == &local_88) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_88,pcVar1);
        if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
          local_88.neg = (bool)(local_88.neg ^ 1);
        }
      }
      else {
        if (pcVar1 != &local_88) {
          local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
          local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
          local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
          local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_88.exp = *(int *)((long)&pnVar2->m_backend + lVar7 + 0x40);
          local_88.neg = *(bool *)((long)&pnVar2->m_backend + lVar7 + 0x44);
          local_88._72_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar7 + 0x48);
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_88,pcVar6);
      }
      if (((local_88.fpclass != cpp_dec_float_NaN) &&
          ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_88,&tol->m_backend), 0 < iVar4)) {
        return false;
      }
      pnVar2 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar2->m_backend).data + lVar7);
      pcVar6 = (cpp_dec_float<100U,_int,_void> *)
               ((long)&((this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar7);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      if (pcVar6 == &local_88) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_88,pcVar1);
        if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
          local_88.neg = (bool)(local_88.neg ^ 1);
        }
      }
      else {
        if (pcVar1 != &local_88) {
          local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
          local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
          local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
          local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar7 + 0x40);
          local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar7 + 0x44);
          local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar7 + 0x48);
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_88,pcVar6);
      }
      if (((local_88.fpclass != cpp_dec_float_NaN) &&
          ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_88,&tol->m_backend), 0 < iVar4)) {
        return false;
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x50;
    } while (lVar5 < (this->thecovectors->set).thenum);
  }
  else {
    if (0 < iVar4) {
      lVar7 = 0;
      lVar5 = 0;
      do {
        pnVar2 = (this->theCoPvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar2->m_backend + lVar7);
        pcVar6 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&(((this->theCoUbound->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar7);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if (pcVar6 == &local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar1);
          if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
            local_88.neg = (bool)(local_88.neg ^ 1);
          }
        }
        else {
          if (pcVar1 != &local_88) {
            local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_88.exp = *(int *)((long)&pnVar2->m_backend + lVar7 + 0x40);
            local_88.neg = *(bool *)((long)&pnVar2->m_backend + lVar7 + 0x44);
            local_88._72_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar7 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar6);
        }
        if (((local_88.fpclass != cpp_dec_float_NaN) &&
            ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&tol->m_backend), 0 < iVar4)) {
          return false;
        }
        pnVar2 = (this->theCoLbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar2->m_backend).data + lVar7);
        pcVar6 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&((this->theCoPvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar7);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if (pcVar6 == &local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar1);
          if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
            local_88.neg = (bool)(local_88.neg ^ 1);
          }
        }
        else {
          if (pcVar1 != &local_88) {
            local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar7 + 0x40);
            local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar7 + 0x44);
            local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar7 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar6);
        }
        if (((local_88.fpclass != cpp_dec_float_NaN) &&
            ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&tol->m_backend), 0 < iVar4)) {
          return false;
        }
        lVar5 = lVar5 + 1;
        lVar7 = lVar7 + 0x50;
      } while (lVar5 < (this->thecovectors->set).thenum);
    }
    if ((this->thevectors->set).thenum < 1) {
      return true;
    }
    lVar7 = 0;
    lVar5 = 0;
    do {
      pnVar2 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar2->m_backend + lVar7);
      pcVar6 = (cpp_dec_float<100U,_int,_void> *)
               ((long)&(((this->theUbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar7);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      if (pcVar6 == &local_88) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_88,pcVar1);
        if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
          local_88.neg = (bool)(local_88.neg ^ 1);
        }
      }
      else {
        if (pcVar1 != &local_88) {
          local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
          local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
          local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
          local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_88.exp = *(int *)((long)&pnVar2->m_backend + lVar7 + 0x40);
          local_88.neg = *(bool *)((long)&pnVar2->m_backend + lVar7 + 0x44);
          local_88._72_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar7 + 0x48);
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_88,pcVar6);
      }
      if (((local_88.fpclass != cpp_dec_float_NaN) &&
          ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_88,&tol->m_backend), 0 < iVar4)) {
        return false;
      }
      pnVar2 = (this->theLbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar2->m_backend).data + lVar7);
      pcVar6 = (cpp_dec_float<100U,_int,_void> *)
               ((long)&((this->thePvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar7);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      if (pcVar6 == &local_88) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_88,pcVar1);
        if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
          local_88.neg = (bool)(local_88.neg ^ 1);
        }
      }
      else {
        if (pcVar1 != &local_88) {
          local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
          local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
          local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
          local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar7 + 0x40);
          local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar7 + 0x44);
          local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar7 + 0x48);
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_88,pcVar6);
      }
      if (((local_88.fpclass != cpp_dec_float_NaN) &&
          ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_88,&tol->m_backend), 0 < iVar4)) {
        return false;
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x50;
    } while (lVar5 < (this->thevectors->set).thenum);
  }
  return true;
}

Assistant:

bool SPxSolverBase<R>::noViols(R tol) const
   {
      assert(tol >= R(0.0));

      if(type() == ENTER)
      {
         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] - theUBbound[i] > tol)
               return false;

            if(theLBbound[i] - (*theFvec)[i] > tol)
               return false;
         }
      }
      else
      {
         assert(type() == LEAVE);

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] - (*theCoUbound)[i] > tol)
               return false;

            if((*theCoLbound)[i] - (*theCoPvec)[i] > tol)
               return false;
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] - (*theUbound)[i] > tol)
               return false;

            if((*theLbound)[i] - (*thePvec)[i] > tol)
               return false;
         }
      }

      return true;
   }